

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

QOffscreenSurface * QRhiGles2InitParams::newFallbackSurface(QSurfaceFormat *format)

{
  bool bVar1;
  QOffscreenSurface *this;
  long in_FS_OFFSET;
  QSurfaceFormat fmt;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  QSurfaceFormat local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QSurfaceFormat::QSurfaceFormat(&local_20,format);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::QOpenGLContext((QOpenGLContext *)local_38,(QObject *)0x0);
  QOpenGLContext::setFormat((QOpenGLContext *)local_38,&local_20);
  bVar1 = QOpenGLContext::create((QOpenGLContext *)local_38);
  if (bVar1) {
    QOpenGLContext::format((QOpenGLContext *)local_40);
    QSurfaceFormat::operator=(&local_20,(QSurfaceFormat *)local_40);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_40);
  }
  else {
    newFallbackSurface();
  }
  this = (QOffscreenSurface *)operator_new(0x28);
  QOffscreenSurface::QOffscreenSurface(this,(QScreen *)0x0,(QObject *)0x0);
  QOffscreenSurface::setFormat(this,&local_20);
  QOffscreenSurface::create(this);
  QOpenGLContext::~QOpenGLContext((QOpenGLContext *)local_38);
  QSurfaceFormat::~QSurfaceFormat(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenSurface *QRhiGles2InitParams::newFallbackSurface(const QSurfaceFormat &format)
{
    QSurfaceFormat fmt = format;

    // To resolve all fields in the format as much as possible, create a context.
    // This may be heavy, but allows avoiding BAD_MATCH on some systems.
    QOpenGLContext tempContext;
    tempContext.setFormat(fmt);
    if (tempContext.create())
        fmt = tempContext.format();
    else
        qWarning("QRhiGles2: Failed to create temporary context");

    QOffscreenSurface *s = new QOffscreenSurface;
    s->setFormat(fmt);
    s->create();

    return s;
}